

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTypeProduct::IfcTypeProduct(IfcTypeProduct *this,void **vtt)

{
  void **vtt_local;
  IfcTypeProduct *this_local;
  
  IfcTypeObject::IfcTypeObject(&this->super_IfcTypeObject,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeProduct,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeProduct,_2UL> *)
             &(this->super_IfcTypeObject).field_0xf0,vtt + 0x10);
  *(void **)&this->super_IfcTypeObject = *vtt;
  *(void **)(&(this->super_IfcTypeObject).field_0x0 +
            *(long *)(*(long *)&this->super_IfcTypeObject + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcTypeObject).field_0x88 = vtt[0x13];
  (this->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcTypeObject).field_0xf0 = vtt[0x15];
  STEP::
  Maybe<Assimp::STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>,_1UL,_0UL>_>
  ::Maybe((Maybe<Assimp::STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>,_1UL,_0UL>_>
           *)&(this->super_IfcTypeObject).field_0x100);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Tag);
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}